

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

_Bool set_config_voice_dir(OpenJTalk *oj,char *path_original)

{
  _Bool _Var1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  char path [260];
  char temp [260];
  char full [260];
  char local_358 [272];
  char local_248 [272];
  char local_138 [272];
  
  if (g_verbose) {
    set_config_voice_dir_cold_1();
  }
  memset(local_358,0,0x104);
  strcpy(local_358,path_original);
  if (oj == (OpenJTalk *)0x0) {
    return false;
  }
  if (local_358[0] == '\0') {
    return false;
  }
  memset(local_248,0,0x104);
  _Var1 = is_relative(local_358);
  if (_Var1) {
    if (g_verbose != false) {
      fprintf(_stderr,anon_var_dwarf_490,local_358);
    }
    sVar2 = strlen(g_ini_dir);
    if (sVar2 == 0) {
      return false;
    }
    sVar3 = strlen(local_358);
    if ((sVar3 + sVar2) - 0x103 < 0xfffffffffffffefb) {
      return false;
    }
    strcpy(local_248,g_ini_dir);
    strcat(local_248,G_SLASH_CHAR);
    strcat(local_248,local_358);
  }
  else {
    if (g_verbose != false) {
      fprintf(_stderr,anon_var_dwarf_4a7,local_358);
    }
    strcpy(local_248,local_358);
  }
  _Var1 = exists_dir(local_248);
  if (_Var1) {
    memset(local_138,0,0x104);
    pcVar4 = realpath(local_248,local_138);
    if (pcVar4 == (char *)0x0) {
      memset(local_138,0,0x104);
    }
    if (g_verbose == true) {
      fprintf(_stderr,anon_var_dwarf_4d5,local_138);
    }
    strcpy(oj->dn_voice_dir_path,local_138);
    return true;
  }
  if (g_verbose != true) {
    return false;
  }
  fprintf(_stderr,anon_var_dwarf_4be,local_248);
  return false;
}

Assistant:

bool set_config_voice_dir(OpenJTalk *oj, const char *path_original)
{
	if (g_verbose)
	{
		console_message(u8"設定ファイルの情報から音響モデルディレクトリを決定\n");
	}

	char path[MAX_PATH];
	clear_path_string(path, MAX_PATH);
#if defined(_WIN32)
	normalize_back_slash(path_original, path);
#else
	strcpy(path, path_original);
#endif

	if (!oj)
	{
		return false;
	}

	if (path != NULL && strlen(path) == 0)
	{
		return false;
	}

	char temp[MAX_PATH];
	clear_path_string(temp, MAX_PATH);

	if (is_relative(path))
	{
		if (g_verbose)
		{
			console_message_string(u8"音響モデルディレクトリ指定は相対指定です。： %s\n", path);
		}

		if (g_ini_dir == NULL || strlen(g_ini_dir) == 0)
		{
			return false;
		}

		if (strlen(g_ini_dir) + 1 + strlen(path) + 1 > MAX_PATH)
		{
			return false;
		}

		strcpy(temp, g_ini_dir);
		strcat(temp, G_SLASH_CHAR);
		strcat(temp, path);
	}
	else
	{
		if (g_verbose)
		{
			console_message_string(u8"音響モデルディレクトリ指定は相対指定ではありません。： %s\n", path);
		}
		strcpy(temp, path);
	}

	if (!exists_dir(temp))
	{
		if (g_verbose)
		{
			console_message_string(u8"指定された音響モデルディレクトリは存在しません。： %s\n", temp);
		}
		return false;
	}

	char full[MAX_PATH];
	clear_path_string(full, MAX_PATH);
	get_fullpath(temp, full);
	if (g_verbose)
	{
		console_message_string(u8"指定された音響モデルディレクトリのフルパス： %s\n", full);
	}

	strcpy(oj->dn_voice_dir_path, full);
	return true;
}